

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOneDimensionalWrapper.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::OneDimensionalWrapper::getLevels
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,OneDimensionalWrapper *this,
          vector<int,_std::allocator<int>_> *point)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_40;
  size_t i;
  allocator<int> local_22;
  undefined1 local_21;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *point_local;
  OneDimensionalWrapper *this_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_21 = 0;
  local_20 = point;
  point_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (OneDimensionalWrapper *)__return_storage_ptr__;
  sVar2 = ::std::vector<int,_std::allocator<int>_>::size(point);
  ::std::allocator<int>::allocator(&local_22);
  ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar2,&local_22);
  ::std::allocator<int>::~allocator(&local_22);
  for (local_40 = 0; sVar2 = ::std::vector<int,_std::allocator<int>_>::size(local_20),
      local_40 < sVar2; local_40 = local_40 + 1) {
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[](local_20,local_40);
    iVar1 = getLevel(this,*pvVar3);
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_40);
    *pvVar4 = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getLevels(std::vector<int> const &point){
        std::vector<int> result(point.size());
        for(size_t i=0; i<point.size(); i++) result[i] = getLevel(point[i]);
        return result;
    }